

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fts5SnippetScore(Fts5ExtensionApi *pApi,Fts5Context *pFts,int nDocsize,uchar *aSeen,int iCol,
                    int iPos,int nToken,int *pnScore,int *piPos)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int nInst;
  int local_80;
  int local_7c;
  uint local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  int local_5c;
  int local_58;
  int local_54;
  Fts5ExtensionApi *local_50;
  Fts5Context *local_48;
  uchar *local_40;
  long local_38;
  
  local_74 = 0;
  local_80 = 0;
  local_78 = 0;
  local_5c = nDocsize;
  local_58 = iCol;
  local_50 = pApi;
  local_48 = pFts;
  local_40 = aSeen;
  iVar3 = (*pApi->xInstCount)(pFts,&local_54);
  if (iVar3 == 0 && 0 < local_54) {
    local_38 = (long)iPos + (long)nToken;
    local_70 = 0xffffffff;
    local_7c = 0;
    iVar7 = 1;
    local_68 = 0;
    do {
      iVar3 = (*local_50->xInst)(local_48,iVar7 + -1,&local_74,&local_80,(int *)&local_78);
      uVar2 = local_78;
      if ((((iVar3 == 0) && (local_80 == local_58)) && (iPos <= (int)local_78)) &&
         ((int)local_78 < local_38)) {
        uVar1 = (int)local_68 + 1000;
        if (local_40[local_74] != '\0') {
          uVar1 = (int)local_68 + 1;
        }
        local_68 = (ulong)uVar1;
        local_40[local_74] = '\x01';
        iVar4 = (int)local_70;
        local_70 = local_70 & 0xffffffff;
        if (iVar4 < 0) {
          local_70 = (ulong)local_78;
        }
        local_7c = (*local_50->xPhraseSize)(local_48,local_74);
        local_7c = local_7c + uVar2;
      }
    } while ((iVar7 < local_54) && (iVar7 = iVar7 + 1, iVar3 == 0));
  }
  else {
    local_68 = 0;
    local_70 = 0xffffffff;
    local_7c = 0;
  }
  *pnScore = (int)local_68;
  if (piPos != (int *)0x0) {
    lVar5 = (long)((int)local_70 - (((int)local_70 + nToken) - local_7c) / 2);
    lVar6 = (long)(local_5c - nToken);
    if (nToken + lVar5 <= (long)local_5c) {
      lVar6 = lVar5;
    }
    iVar7 = 0;
    if (0 < lVar6) {
      iVar7 = (int)lVar6;
    }
    *piPos = iVar7;
  }
  return iVar3;
}

Assistant:

static int fts5SnippetScore(
  const Fts5ExtensionApi *pApi,   /* API offered by current FTS version */
  Fts5Context *pFts,              /* First arg to pass to pApi functions */
  int nDocsize,                   /* Size of column in tokens */
  unsigned char *aSeen,           /* Array with one element per query phrase */
  int iCol,                       /* Column to score */
  int iPos,                       /* Starting offset to score */
  int nToken,                     /* Max tokens per snippet */
  int *pnScore,                   /* OUT: Score */
  int *piPos                      /* OUT: Adjusted offset */
){
  int rc;
  int i;
  int ip = 0;
  int ic = 0;
  int iOff = 0;
  int iFirst = -1;
  int nInst;
  int nScore = 0;
  int iLast = 0;
  sqlite3_int64 iEnd = (sqlite3_int64)iPos + nToken;

  rc = pApi->xInstCount(pFts, &nInst);
  for(i=0; i<nInst && rc==SQLITE_OK; i++){
    rc = pApi->xInst(pFts, i, &ip, &ic, &iOff);
    if( rc==SQLITE_OK && ic==iCol && iOff>=iPos && iOff<iEnd ){
      nScore += (aSeen[ip] ? 1 : 1000);
      aSeen[ip] = 1;
      if( iFirst<0 ) iFirst = iOff;
      iLast = iOff + pApi->xPhraseSize(pFts, ip);
    }
  }

  *pnScore = nScore;
  if( piPos ){
    sqlite3_int64 iAdj = iFirst - (nToken - (iLast-iFirst)) / 2;
    if( (iAdj+nToken)>nDocsize ) iAdj = nDocsize - nToken;
    if( iAdj<0 ) iAdj = 0;
    *piPos = (int)iAdj;
  }

  return rc;
}